

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall clipp::parser::operator()(parser *this,arg_string *arg)

{
  bool bVar1;
  child_t<clipp::parameter,_clipp::group> *in_RSI;
  parser *in_RDI;
  arg_string *in_stack_000001e0;
  parser *in_stack_000001e8;
  arg_string *in_stack_000001f0;
  parser *in_stack_000001f8;
  arg_string *in_stack_ffffffffffffffd8;
  bool local_1;
  
  in_RDI->eaten_ = in_RDI->eaten_ + 1;
  in_RDI->index_ = in_RDI->index_ + 1;
  bVar1 = valid((parser *)0x18d7fb);
  if (bVar1) {
    if (((in_RDI->blocked_ & 1U) == 0) &&
       (bVar1 = try_match(in_stack_000001f8,in_stack_000001f0), bVar1)) {
      local_1 = true;
    }
    else {
      bVar1 = try_match_blocked(in_stack_000001e8,in_stack_000001e0);
      if (bVar1) {
        local_1 = false;
      }
      else {
        if (((in_RDI->blocked_ & 1U) == 0) &&
           (bVar1 = detail::scoped_dfs_traverser::matched((scoped_dfs_traverser *)0x18d86e), !bVar1)
           ) {
          detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x18d880);
          bVar1 = group::child_t<clipp::parameter,_clipp::group>::required(in_RSI);
          if (bVar1) {
            detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x18d89c);
            bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(in_RSI);
            if (bVar1) {
              in_RDI->blocked_ = true;
            }
          }
        }
        add_nomatch(in_RDI,in_stack_ffffffffffffffd8);
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator() (const arg_string& arg)
    {
        ++eaten_;
        ++index_;

        if(!valid()) return false;

        if(!blocked_ && try_match(arg)) return true;

        if(try_match_blocked(arg)) return false;

        //skipping of blocking & required patterns is not allowed
        if(!blocked_ && !pos_.matched() && pos_->required() && pos_->blocking()) {
            blocked_ = true;
        }

        add_nomatch(arg);
        return false;
    }